

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::CompressionParameters>::setCapacity
          (Vector<kj::CompressionParameters> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::CompressionParameters> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x28)) {
    ArrayBuilder<kj::CompressionParameters>::truncate(&this->builder,(char *)newSize,lVar1 % 0x28);
  }
  newBuilder.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::CompressionParameters>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::CompressionParameters>::addAll<kj::ArrayBuilder<kj::CompressionParameters>>
            (&newBuilder,&this->builder);
  ArrayBuilder<kj::CompressionParameters>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::CompressionParameters>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }